

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNode<int,_int>::MultiNode(MultiNode<int,_int> *this,MultiNode<int,_int> *other)

{
  Chain *pCVar1;
  MultiNodeChain<int> **ppMVar2;
  
  this->key = other->key;
  ppMVar2 = &this->value;
  while (other = (MultiNode<int,_int> *)other->value, other != (MultiNode<int,_int> *)0x0) {
    pCVar1 = (Chain *)operator_new(0x10);
    pCVar1->value = other->key;
    pCVar1->next = (MultiNodeChain<int> *)0x0;
    *ppMVar2 = pCVar1;
    ppMVar2 = &pCVar1->next;
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }